

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImGuiWindow * ImGui::FindBottomMostVisibleWindowWithinBeginStack(ImGuiWindow *parent_window)

{
  ImGuiWindow **ppIVar1;
  ImGuiWindow *pIVar2;
  ImGuiWindow *pIVar3;
  bool bVar4;
  ImGuiContext *g;
  ImGuiWindow *pIVar5;
  ImGuiWindow **ppIVar6;
  ulong uVar7;
  long lVar8;
  
  ppIVar1 = (GImGui->Windows).Data;
  lVar8 = (long)(GImGui->Windows).Size;
  ppIVar6 = ppIVar1;
  if (0 < lVar8) {
    do {
      if (*ppIVar6 == parent_window) break;
      ppIVar6 = ppIVar6 + 1;
    } while (ppIVar6 < ppIVar1 + lVar8);
  }
  if (((ulong)((long)ppIVar6 - (long)ppIVar1) >> 0x22 & 1) != 0) {
    return parent_window;
  }
  pIVar5 = parent_window;
  uVar7 = (ulong)((uint)((ulong)((long)ppIVar6 - (long)ppIVar1) >> 3) & 0x7fffffff);
  do {
    pIVar2 = (GImGui->Windows).Data[uVar7];
    bVar4 = false;
    if (((uint)pIVar2->Flags >> 0x18 & 1) == 0) {
      if (pIVar2->RootWindow == parent_window) {
LAB_001182e3:
        bVar4 = false;
        if (((pIVar2->Active == true) && (pIVar2->Hidden == false)) &&
           (((uint)pIVar2->Flags >> 0x19 & 1) <=
            (uint)(((uint)parent_window->Flags >> 0x19 & 1) != 0))) {
          pIVar5 = pIVar2;
          bVar4 = false;
        }
      }
      else {
        for (pIVar3 = pIVar2; bVar4 = true, pIVar3 != (ImGuiWindow *)0x0;
            pIVar3 = pIVar3->ParentWindowInBeginStack) {
          if (pIVar3 == parent_window) goto LAB_001182e3;
        }
      }
    }
    if ((bVar4) || (bVar4 = (long)uVar7 < 1, uVar7 = uVar7 - 1, bVar4)) {
      return pIVar5;
    }
  } while( true );
}

Assistant:

ImGuiWindow* ImGui::FindBottomMostVisibleWindowWithinBeginStack(ImGuiWindow* parent_window)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* bottom_most_visible_window = parent_window;
    for (int i = FindWindowDisplayIndex(parent_window); i >= 0; i--)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Flags & ImGuiWindowFlags_ChildWindow)
            continue;
        if (!IsWindowWithinBeginStackOf(window, parent_window))
            break;
        if (IsWindowActiveAndVisible(window) && GetWindowDisplayLayer(window) <= GetWindowDisplayLayer(parent_window))
            bottom_most_visible_window = window;
    }
    return bottom_most_visible_window;
}